

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O1

FieldBase * __thiscall FIX::FieldMap::getField(FieldMap *this,FieldBase *field)

{
  FieldBase *pFVar1;
  
  pFVar1 = getFieldRef(this,field->m_tag);
  field->m_tag = pFVar1->m_tag;
  std::__cxx11::string::_M_assign((string *)&field->m_string);
  (field->m_metrics).m_checksum = (pFVar1->m_metrics).m_checksum;
  (field->m_metrics).m_length = (pFVar1->m_metrics).m_length;
  (field->m_data)._M_string_length = 0;
  *(field->m_data)._M_dataplus._M_p = '\0';
  return field;
}

Assistant:

FieldBase& getField( FieldBase& field )
  const EXCEPT ( FieldNotFound )
  {
    field = getFieldRef( field.getTag() );
    return field;
  }